

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O1

bool add_packed_varyings(gl_context *ctx,gl_shader_program *shProg,set *resource_set,int stage,
                        GLenum type)

{
  char cVar1;
  undefined8 *puVar2;
  long *plVar3;
  char *__s2;
  long lVar4;
  long *plVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  uint stage_mask;
  int iVar9;
  size_t sVar10;
  char *__ptr;
  char *pcVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  glsl_type *in_stack_ffffffffffffff60;
  byte local_7c;
  char *local_38;
  
  iVar14 = (int)resource_set;
  lVar13 = *(long *)((ctx->GLThread).queue.name + (long)iVar14 * 8 + 0x78);
  bVar16 = true;
  if ((lVar13 != 0) && (puVar2 = *(undefined8 **)(lVar13 + 0x28), puVar2 != (undefined8 *)0x0)) {
    plVar3 = (long *)*puVar2;
    bVar16 = *plVar3 == 0;
    if (!bVar16) {
      do {
        if ((int)plVar3[2] == 7) {
          uVar12 = *(uint *)(plVar3 + 7) >> 0xc & 0xf;
          stage_mask = 0x92e3;
          if (uVar12 != 4) {
            if (uVar12 != 5) {
              __assert_fail("!\"unexpected type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                            ,0xf97,
                            "bool add_packed_varyings(const struct gl_context *, struct gl_shader_program *, struct set *, int, GLenum)"
                           );
            }
            stage_mask = 0x92e4;
          }
          if (stage_mask == stage) {
            __s2 = (char *)plVar3[4];
            lVar13 = 0;
            bVar6 = 0;
            do {
              lVar4 = *(long *)((ctx->GLThread).queue.name + lVar13 * 8 + 0x78);
              if ((lVar4 != 0) && (plVar5 = (long *)**(undefined8 **)(lVar4 + 0x20), *plVar5 != 0))
              {
                do {
                  iVar15 = 0;
                  if ((int)plVar5[2] == 7) {
                    pcVar11 = (char *)plVar5[4];
                    sVar10 = strlen(pcVar11);
                    in_stack_ffffffffffffff60 = (glsl_type *)0x1662cc;
                    iVar9 = strncmp(pcVar11,"packed:",7);
                    if (iVar9 == 0) {
                      __ptr = strdup(pcVar11 + 7);
                      pcVar11 = __ptr;
                      if (__ptr == (char *)0x0) {
                        __assert_fail("list",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/linker.cpp"
                                      ,0xe15,
                                      "bool included_in_packed_varying(ir_variable *, const char *)"
                                     );
                      }
                      while( true ) {
                        pcVar11 = strtok_r(pcVar11,",",&local_38);
                        if (pcVar11 == (char *)0x0) break;
                        iVar9 = strcmp(pcVar11,__s2);
                        if (iVar9 == 0) {
                          in_stack_ffffffffffffff60 = (glsl_type *)0x16639d;
                          free(__ptr);
                          goto LAB_001663a0;
                        }
                        pcVar11 = (char *)0x0;
                      }
                      in_stack_ffffffffffffff60 = (glsl_type *)0x166382;
                      free(__ptr);
                      if (pcVar11 == (char *)0x0) goto LAB_001662d0;
LAB_001663a0:
                      local_7c = (byte)(1 << ((byte)lVar13 & 0x1f));
                      bVar6 = bVar6 | local_7c;
                      iVar15 = 5;
                    }
                    else {
LAB_001662d0:
                      if ((*(uint *)(plVar5 + 7) >> 0xc & 0xf) == uVar12) {
                        in_stack_ffffffffffffff60 = (glsl_type *)0x1662f6;
                        iVar9 = strncmp((char *)plVar5[4],__s2,sVar10 & 0xffffffff);
                        if ((iVar9 == 0) &&
                           (((cVar1 = __s2[sVar10 & 0xffffffff], cVar1 == '\0' || (cVar1 == '[')) ||
                            (iVar15 = 0, cVar1 == '.')))) goto LAB_001663a0;
                      }
                      else {
                        iVar15 = 7;
                      }
                    }
                  }
                } while (((iVar15 == 7) || (iVar15 == 0)) &&
                        (plVar5 = (long *)*plVar5, *plVar5 != 0));
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 6);
            if ((*(uint *)(plVar3 + 7) & 8) == 0) {
              uVar12 = *(uint *)(plVar3 + 7) >> 0xc & 0xf;
              bVar7 = 1;
              if ((uVar12 != 5 || iVar14 != 1) && (2 < iVar14 - 1U || uVar12 != 4))
              goto LAB_00166421;
            }
            else {
LAB_00166421:
              bVar7 = 0;
            }
            bVar8 = add_shader_variable(ctx,shProg,(set *)(ulong)bVar6,stage_mask,(int)plVar3 - 8,
                                        (ir_variable *)plVar3[4],(char *)plVar3[3],(glsl_type *)0x0,
                                        (bool)((char)(int)plVar3[9] + -0x20),(uint)bVar7,false,
                                        in_stack_ffffffffffffff60);
            if (!bVar8) {
              return bVar16;
            }
          }
        }
        plVar3 = (long *)*plVar3;
        bVar16 = *plVar3 == 0;
      } while (!bVar16);
    }
  }
  return bVar16;
}

Assistant:

static bool
add_packed_varyings(const struct gl_context *ctx,
                    struct gl_shader_program *shProg,
                    struct set *resource_set,
                    int stage, GLenum type)
{
   struct gl_linked_shader *sh = shProg->_LinkedShaders[stage];
   GLenum iface;

   if (!sh || !sh->packed_varyings)
      return true;

   foreach_in_list(ir_instruction, node, sh->packed_varyings) {
      ir_variable *var = node->as_variable();
      if (var) {
         switch (var->data.mode) {
         case ir_var_shader_in:
            iface = GL_PROGRAM_INPUT;
            break;
         case ir_var_shader_out:
            iface = GL_PROGRAM_OUTPUT;
            break;
         default:
            unreachable("unexpected type");
         }

         if (type == iface) {
            const int stage_mask =
               build_stageref(shProg, var->name, var->data.mode);
            if (!add_shader_variable(ctx, shProg, resource_set,
                                     stage_mask,
                                     iface, var, var->name, var->type, false,
                                     var->data.location - VARYING_SLOT_VAR0,
                                     inout_has_same_location(var, stage)))
               return false;
         }
      }
   }
   return true;
}